

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reply_deferrable.c
# Opt level: O2

int deferReply(mpt_reply_context_detached *def,mpt_message *msg)

{
  _mpt_vptr_reply_context_detached *__ptr;
  int iVar1;
  uintptr_t uVar2;
  
  iVar1 = contextSend((mpt_reply_context_defer *)def[1]._vptr,(mpt_reply_data *)(def + 2),msg);
  if (iVar1 < 0) {
    if (msg != (mpt_message *)0x0) {
      return iVar1;
    }
    iVar1 = 0;
  }
  __ptr = def[1]._vptr;
  uVar2 = mpt_refcount_lower((mpt_refcount *)(__ptr + 2));
  if (uVar2 == 0) {
    free(__ptr);
  }
  free(def);
  return iVar1;
}

Assistant:

static int deferReply(MPT_STRUCT(reply_context_detached) *def, const MPT_STRUCT(message) *msg)
{
	struct replyDataDelayed *rd = (void *) def;
	int ret;
	if ((ret = contextSend(rd->base, &rd->data, msg)) < 0) {
		if (msg) {
			return ret;
		} else {
			ret = 0;
		}
	}
	contextDetach(rd->base);
	free(def);
	return ret;
}